

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O3

Abc_Ntk_t *
Abc_NtkDarLatchSweep
          (Abc_Ntk_t *pNtk,int fLatchConst,int fLatchEqual,int fSaveNames,int fUseMvSweep,
          int nFramesSymb,int nFramesSatur,int fVerbose,int fVeryVerbose)

{
  Vec_Int_t *__ptr;
  Aig_Man_t *pAig;
  Aig_Man_t *p;
  Abc_Ntk_t *pAVar1;
  
  pAig = Abc_NtkToDar(pNtk,0,1);
  if (pAig == (Aig_Man_t *)0x0) {
    pAVar1 = (Abc_Ntk_t *)0x0;
  }
  else {
    if (fSaveNames == 0) {
      __ptr = pAig->vFlopNums;
      if (__ptr != (Vec_Int_t *)0x0) {
        if (__ptr->pArray != (int *)0x0) {
          free(__ptr->pArray);
        }
        free(__ptr);
      }
      pAig->vFlopNums = (Vec_Int_t *)0x0;
      p = Aig_ManScl(pAig,fLatchConst,fLatchEqual,fUseMvSweep,nFramesSymb,nFramesSatur,fVerbose,
                     fVeryVerbose);
      Aig_ManStop(pAig);
    }
    else {
      Aig_ManSeqCleanup(pAig);
      p = pAig;
      if ((fLatchConst != 0) && (pAig->nRegs != 0)) {
        p = Aig_ManConstReduce(pAig,fUseMvSweep,nFramesSymb,nFramesSatur,fVerbose,fVeryVerbose);
      }
      if ((fLatchEqual != 0) && (p->nRegs != 0)) {
        p = Aig_ManReduceLaches(p,fVerbose);
      }
    }
    pAVar1 = Abc_NtkFromDarSeqSweep(pNtk,p);
    Aig_ManStop(p);
  }
  return pAVar1;
}

Assistant:

Abc_Ntk_t * Abc_NtkDarLatchSweep( Abc_Ntk_t * pNtk, int fLatchConst, int fLatchEqual, int fSaveNames, int fUseMvSweep, int nFramesSymb, int nFramesSatur, int fVerbose, int fVeryVerbose )
{
    extern void Aig_ManPrintControlFanouts( Aig_Man_t * p );
    Abc_Ntk_t * pNtkAig;
    Aig_Man_t * pMan, * pTemp;
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
        return NULL;
    if ( fSaveNames )
    {
        Aig_ManSeqCleanup( pMan );
        if ( fLatchConst && pMan->nRegs )
            pMan = Aig_ManConstReduce( pMan, fUseMvSweep, nFramesSymb, nFramesSatur, fVerbose, fVeryVerbose );
        if ( fLatchEqual && pMan->nRegs )
            pMan = Aig_ManReduceLaches( pMan, fVerbose );
    }
    else
    {
        if ( pMan->vFlopNums )
            Vec_IntFree( pMan->vFlopNums );
        pMan->vFlopNums = NULL;
        pMan = Aig_ManScl( pTemp = pMan, fLatchConst, fLatchEqual, fUseMvSweep, nFramesSymb, nFramesSatur, fVerbose, fVeryVerbose );
        Aig_ManStop( pTemp );
    }

    pNtkAig = Abc_NtkFromDarSeqSweep( pNtk, pMan );
//Aig_ManPrintControlFanouts( pMan );
    Aig_ManStop( pMan );
    return pNtkAig;
}